

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O1

ConsumeResult * __thiscall
binlog::Session::consume<std::__cxx11::stringstream>
          (ConsumeResult *__return_storage_ptr__,Session *this,
          basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *entry;
  _Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_> _Var6;
  ulong uVar7;
  int iVar8;
  size_t sVar9;
  __normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
  __first;
  undefined8 uVar10;
  long lVar11;
  uint64_t uVar12;
  ulong uVar13;
  ulong uVar14;
  shared_ptr<binlog::Session::Channel> *channelptr;
  pointer psVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  pthread_mutex_t *local_70;
  
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar8 != 0) {
    uVar10 = std::__throw_system_error(iVar8);
    pthread_mutex_unlock(local_70);
    _Unwind_Resume(uVar10);
  }
  __return_storage_ptr__->channelsPolled = 0;
  __return_storage_ptr__->channelsRemoved = 0;
  __return_storage_ptr__->bytesConsumed = 0;
  __return_storage_ptr__->totalBytesConsumed = 0;
  if (this->_consumeClockSync == true) {
    std::ostream::write((char *)(out + 0x10),
                        (long)((this->_clockSync)._vector.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start + 0x18));
    __return_storage_ptr__->bytesConsumed =
         (size_t)((this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (__return_storage_ptr__->bytesConsumed -
                 (long)(this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start) + -0x18);
    this->_consumeClockSync = false;
  }
  pcVar2 = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar16 = (-(long)pcVar2 - this->_sourcesConsumePos) + -0x18;
  pbVar1 = out + 0x10;
  std::ostream::write((char *)pbVar1,(long)(pcVar2 + this->_sourcesConsumePos + 0x18));
  this->_sourcesConsumePos = (streamsize)(pcVar3 + this->_sourcesConsumePos + lVar16);
  __return_storage_ptr__->bytesConsumed =
       (size_t)(pcVar3 + __return_storage_ptr__->bytesConsumed + lVar16);
  psVar15 = (this->_channels).
            super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->_channels).
           super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar15 == psVar4) {
      __first = std::
                __remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<binlog::Session::Channel>*,std::vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>>,__gnu_cxx::__ops::_Iter_pred<binlog::Session::consume<std::__cxx11::stringstream>(std::__cxx11::stringstream&)::_lambda(std::shared_ptr<binlog::Session::Channel>const&)_1_>>
                          ((this->_channels).
                           super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->_channels).
                           super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
      ::_M_erase(&this->_channels,(iterator)__first._M_current,
                 (this->_channels).
                 super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      sVar9 = this->_totalConsumedBytes + __return_storage_ptr__->bytesConsumed;
      this->_totalConsumedBytes = sVar9;
      __return_storage_ptr__->totalBytesConsumed = sVar9;
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return __return_storage_ptr__;
    }
    p_Var5 = (psVar15->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar18 = false;
    }
    else {
      bVar18 = p_Var5->_M_use_count == 1;
    }
    entry = (psVar15->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
    _Var6.super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (entry->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>;
    uVar7 = *(ulong *)((long)_Var6.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x10);
    uVar17 = *(ulong *)((long)_Var6.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30);
    if (uVar7 < uVar17) {
      lVar11 = *(long *)((long)_Var6.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x28);
      uVar13 = *(ulong *)((long)_Var6.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x18) -
               uVar17;
      uVar14 = uVar7;
      lVar16 = lVar11;
      if (*(ulong *)((long)_Var6.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x18) < uVar17
          || uVar13 == 0) goto LAB_001b1598;
      lVar16 = uVar17 + lVar11;
      uVar14 = uVar13;
      uVar17 = uVar7;
    }
    else {
      uVar14 = uVar7 - uVar17;
      lVar16 = uVar17 + *(long *)((long)_Var6.super__Head_base<0UL,_char_*,_false>._M_head_impl +
                                 0x28);
LAB_001b1598:
      uVar17 = 0;
      lVar11 = 0;
    }
    uVar12 = uVar17 + uVar14;
    if (uVar12 != 0) {
      (entry->writerProp).batchSize = uVar12;
      sVar9 = consumeSpecialEntry<binlog::WriterProp,std::__cxx11::stringstream>
                        (this,&entry->writerProp,out);
      __return_storage_ptr__->bytesConsumed = __return_storage_ptr__->bytesConsumed + sVar9;
      std::ostream::write((char *)pbVar1,lVar16);
      if (uVar17 != 0) {
        std::ostream::write((char *)pbVar1,lVar11);
      }
      *(ulong *)((long)_Var6.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30) = uVar7;
      __return_storage_ptr__->bytesConsumed = __return_storage_ptr__->bytesConsumed + uVar12;
    }
    if (bVar18) {
      p_Var5 = (psVar15->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      (psVar15->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      (psVar15->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      __return_storage_ptr__->channelsRemoved = __return_storage_ptr__->channelsRemoved + 1;
    }
    __return_storage_ptr__->channelsPolled = __return_storage_ptr__->channelsPolled + 1;
    psVar15 = psVar15 + 1;
  } while( true );
}

Assistant:

Session::ConsumeResult Session::consume(OutputStream& out)
{
  // This lock:
  //  - Ensures only a single consumer is running at a time
  //  - Ensures safe read of _channels
  //  - Ensures safe read of Channel::writerProp (written by setChannelWriterName)
  //  - Ensures safe read of _sources
  //  - Ensures no new EventSource can be added to _sources while consuming
  //
  // Without this lock, the following becomes possible:
  //  - Consumer starts, consumes _sources
  //  - Producer1 adds a new elem (ES123) to sources
  //  - Producer2 finds that ES123 is already added
  //  - Producer2 adds a new event using ES123
  //  - Consumer continues, consumes the event added by Producer2
  // This would result in a corrupt stream, as the event source
  // must precede every event referencing it. This is solved by the lock
  // that blocks P1 *and* P2 while adding ES123.
  std::lock_guard<std::mutex> lock(_mutex);

  ConsumeResult result;

  // add a clock sync if not yet added
  if (_consumeClockSync)
  {
    out.write(_clockSync.data(), _clockSync.ssize());
    result.bytesConsumed += std::size_t(_clockSync.ssize());
    _consumeClockSync = false;
  }

  // consume event sources before events
  const std::streamsize sourceWriteSize = _sources.ssize() - _sourcesConsumePos;
  out.write(_sources.data() + _sourcesConsumePos, sourceWriteSize);
  _sourcesConsumePos += sourceWriteSize;
  result.bytesConsumed += std::size_t(sourceWriteSize);

  // consume some events
  for (std::shared_ptr<Channel>& channelptr : _channels)
  {
    // Important to check if channel is closed before beginRead,
    // otherwise the following race becomes possible:
    //  - Consumer finds queue is empty
    //  - Producer adds data
    //  - Producer closes the queue
    //  - Consumer finds queue is closed, removes it -> data loss
    const bool isClosed = (channelptr.use_count() == 1);

    Channel& ch = *channelptr;

    detail::QueueReader reader(ch.queue());
    const detail::QueueReader::ReadResult data = reader.beginRead();
    if (data.size())
    {
      // consume writerProp entry
      ch.writerProp.batchSize = data.size();
      result.bytesConsumed += consumeSpecialEntry(ch.writerProp, out);

      // consume queue data
      out.write(data.buffer1, std::streamsize(data.size1));
      if (data.size2)
      {
        // data wraps around the end of the queue, consume the second half as well
        out.write(data.buffer2, std::streamsize(data.size2));
      }

      reader.endRead();
      result.bytesConsumed += data.size();
    }

    if (isClosed)
    {
      // queue is empty and closed, remove it
      channelptr.reset();
      result.channelsRemoved++;
    }

    result.channelsPolled++;
  }

  // remove empty and closed channels
  _channels.erase(
    std::remove_if(
      _channels.begin(), _channels.end(),
      [](const std::shared_ptr<Channel>& channelptr) { return !channelptr; }
    ),
    _channels.end()
  );

  _totalConsumedBytes += result.bytesConsumed;
  result.totalBytesConsumed = _totalConsumedBytes;

  return result;
}